

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O0

void __thiscall IRCCommand::setAccessLevel(IRCCommand *this,string_view channel,int accessLevel)

{
  allocator<char> local_51;
  value_type local_50;
  int local_24;
  IRCCommand *pIStack_20;
  int accessLevel_local;
  IRCCommand *this_local;
  string_view channel_local;
  
  channel_local._M_len = (size_t)channel._M_str;
  this_local = (IRCCommand *)channel._M_len;
  local_24 = accessLevel;
  pIStack_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_51);
  local_50.access = local_24;
  std::vector<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>::
  push_back(&this->m_channels,&local_50);
  ChannelAccessPair::~ChannelAccessPair(&local_50);
  std::allocator<char>::~allocator(&local_51);
  return;
}

Assistant:

void IRCCommand::setAccessLevel(std::string_view channel, int accessLevel) {
	m_channels.push_back({ static_cast<std::string>(channel), accessLevel });
}